

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

void __thiscall CMU462::Edge::translate(Edge *this,double dx,double dy,Matrix4x4 *modelViewProj)

{
  Edge *this_00;
  _List_node_base *p_Var1;
  
  p_Var1 = (this->_halfedge)._M_node;
  this_00 = this;
  do {
    HalfedgeElement::translatePoint
              (&this_00->super_HalfedgeElement,(Vector3D *)&p_Var1[2]._M_prev[1]._M_prev,dx,dy,
               modelViewProj);
    p_Var1 = p_Var1[1]._M_prev;
  } while ((this->_halfedge)._M_node != p_Var1);
  return;
}

Assistant:

void Edge::translate(double dx, double dy, const Matrix4x4& modelViewProj) {
  HalfedgeIter h = halfedge();
  do {
    translatePoint(h->vertex()->position, dx, dy, modelViewProj);
    h = h->twin();
  } while (h != halfedge());
}